

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlChar * xmlNodeGetBase(xmlDoc *doc,xmlNode *cur)

{
  xmlNode *node;
  bool bVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  long lVar6;
  _xmlNode **pp_Var7;
  xmlEntityPtr ent;
  
  if ((doc == (xmlDoc *)0x0 && cur == (xmlNode *)0x0) ||
     ((cur != (xmlNode *)0x0 && (cur->type == XML_NAMESPACE_DECL)))) {
LAB_00181e93:
    pxVar5 = (xmlChar *)0x0;
  }
  else {
    if ((doc == (xmlDoc *)0x0) && (doc = cur->doc, doc == (_xmlDoc *)0x0)) {
      bVar1 = true;
      doc = (_xmlDoc *)0x0;
    }
    else {
      if (doc->type == XML_HTML_DOCUMENT_NODE) {
        pp_Var7 = &doc->children;
        while( true ) {
          node = *pp_Var7;
          if (node == (xmlNode *)0x0) {
            return (xmlChar *)0x0;
          }
          if (node->name == (xmlChar *)0x0) break;
          lVar6 = 0x30;
          if ((((node->type == XML_ELEMENT_NODE) &&
               (iVar2 = xmlStrcasecmp(node->name,"html"), lVar6 = 0x18, iVar2 != 0)) &&
              (iVar2 = xmlStrcasecmp(node->name,"head"), iVar2 != 0)) &&
             (iVar2 = xmlStrcasecmp(node->name,"base"), lVar6 = 0x30, iVar2 == 0)) {
            pxVar5 = xmlGetProp(node,"href");
            return pxVar5;
          }
          pp_Var7 = (_xmlNode **)((long)&node->_private + lVar6);
        }
        return (xmlChar *)0x0;
      }
      bVar1 = false;
    }
    pxVar5 = (xmlChar *)0x0;
    for (; cur != (xmlNode *)0x0; cur = cur->parent) {
      if (cur->type == XML_ELEMENT_NODE) {
        pxVar3 = xmlGetNsProp(cur,"base",(xmlChar *)"http://www.w3.org/XML/1998/namespace");
        if (pxVar3 != (xmlChar *)0x0) {
          if (pxVar5 != (xmlChar *)0x0) {
            pxVar4 = xmlBuildURI(pxVar5,pxVar3);
            (*xmlFree)(pxVar5);
            (*xmlFree)(pxVar3);
            pxVar3 = pxVar4;
            if (pxVar4 == (xmlChar *)0x0) goto LAB_00181e93;
          }
          iVar2 = xmlStrncmp(pxVar3,(xmlChar *)"http://",7);
          if (iVar2 == 0) {
            return pxVar3;
          }
          iVar2 = xmlStrncmp(pxVar3,(xmlChar *)"ftp://",6);
          if (iVar2 == 0) {
            return pxVar3;
          }
          iVar2 = xmlStrncmp(pxVar3,(xmlChar *)"urn:",4);
          pxVar5 = pxVar3;
          if (iVar2 == 0) {
            return pxVar3;
          }
        }
      }
      else if (cur->type == XML_ENTITY_DECL) {
        pxVar3 = (xmlChar *)cur[1]._private;
        goto LAB_00182064;
      }
    }
    if ((!bVar1) && (pxVar3 = doc->URL, pxVar3 != (xmlChar *)0x0)) {
      if (pxVar5 == (xmlChar *)0x0) {
LAB_00182064:
        pxVar5 = xmlStrdup(pxVar3);
        return pxVar5;
      }
      pxVar3 = xmlBuildURI(pxVar5,pxVar3);
      (*xmlFree)(pxVar5);
      pxVar5 = pxVar3;
    }
  }
  return pxVar5;
}

Assistant:

xmlChar *
xmlNodeGetBase(const xmlDoc *doc, const xmlNode *cur) {
    xmlChar *oldbase = NULL;
    xmlChar *base, *newbase;

    if ((cur == NULL) && (doc == NULL))
        return(NULL);
    if ((cur != NULL) && (cur->type == XML_NAMESPACE_DECL))
        return(NULL);
    if (doc == NULL) doc = cur->doc;
    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        cur = doc->children;
	while ((cur != NULL) && (cur->name != NULL)) {
	    if (cur->type != XML_ELEMENT_NODE) {
	        cur = cur->next;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "html")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "head")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "base")) {
                return(xmlGetProp(cur, BAD_CAST "href"));
	    }
	    cur = cur->next;
	}
	return(NULL);
    }
    while (cur != NULL) {
	if (cur->type == XML_ENTITY_DECL) {
	    xmlEntityPtr ent = (xmlEntityPtr) cur;
	    return(xmlStrdup(ent->URI));
	}
	if (cur->type == XML_ELEMENT_NODE) {
	    base = xmlGetNsProp(cur, BAD_CAST "base", XML_XML_NAMESPACE);
	    if (base != NULL) {
		if (oldbase != NULL) {
		    newbase = xmlBuildURI(oldbase, base);
		    if (newbase != NULL) {
			xmlFree(oldbase);
			xmlFree(base);
			oldbase = newbase;
		    } else {
			xmlFree(oldbase);
			xmlFree(base);
			return(NULL);
		    }
		} else {
		    oldbase = base;
		}
		if ((!xmlStrncmp(oldbase, BAD_CAST "http://", 7)) ||
		    (!xmlStrncmp(oldbase, BAD_CAST "ftp://", 6)) ||
		    (!xmlStrncmp(oldbase, BAD_CAST "urn:", 4)))
		    return(oldbase);
	    }
	}
	cur = cur->parent;
    }
    if ((doc != NULL) && (doc->URL != NULL)) {
	if (oldbase == NULL)
	    return(xmlStrdup(doc->URL));
	newbase = xmlBuildURI(oldbase, doc->URL);
	xmlFree(oldbase);
	return(newbase);
    }
    return(oldbase);
}